

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_filter.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConstantFilter::ToExpression(ConstantFilter *this,Expression *column)

{
  BoundConstantExpression *this_00;
  BoundComparisonExpression *this_01;
  long *in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_70;
  Value local_68;
  
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value(&local_68,(Value *)&(column->super_BaseExpression).alias);
  BoundConstantExpression::BoundConstantExpression(this_00,&local_68);
  Value::~Value(&local_68);
  (**(code **)(*in_RDX + 0x88))(&local_78);
  this_01 = (BoundComparisonExpression *)operator_new(0x68);
  local_68.type_._0_8_ = local_78._M_head_impl;
  local_78._M_head_impl = (Expression *)0x0;
  local_70._M_head_impl = (Expression *)this_00;
  BoundComparisonExpression::BoundComparisonExpression
            (this_01,(column->super_BaseExpression).expression_class,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_68,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_70);
  if ((BoundConstantExpression *)local_70._M_head_impl != (BoundConstantExpression *)0x0) {
    (*(((Expression *)&(local_70._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  local_70._M_head_impl = (Expression *)0x0;
  if ((Expression *)local_68.type_._0_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_68.type_._0_8_ + 8))();
  }
  if (local_78._M_head_impl != (Expression *)0x0) {
    (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_01;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ConstantFilter::ToExpression(const Expression &column) const {
	auto bound_constant = make_uniq<BoundConstantExpression>(constant);
	auto result = make_uniq<BoundComparisonExpression>(comparison_type, column.Copy(), std::move(bound_constant));
	return std::move(result);
}